

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  string *psVar2;
  cmOSXBundleGenerator *this_01;
  string local_50;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_005c9730;
  (this->TargetNameOut)._M_dataplus._M_p = (pointer)&(this->TargetNameOut).field_2;
  (this->TargetNameOut)._M_string_length = 0;
  (this->TargetNameOut).field_2._M_local_buf[0] = '\0';
  (this->TargetNameSO)._M_dataplus._M_p = (pointer)&(this->TargetNameSO).field_2;
  (this->TargetNameSO)._M_string_length = 0;
  (this->TargetNameSO).field_2._M_local_buf[0] = '\0';
  (this->TargetNameReal)._M_dataplus._M_p = (pointer)&(this->TargetNameReal).field_2;
  (this->TargetNameReal)._M_string_length = 0;
  (this->TargetNameReal).field_2._M_local_buf[0] = '\0';
  (this->TargetNameImport)._M_dataplus._M_p = (pointer)&(this->TargetNameImport).field_2;
  (this->TargetNameImport)._M_string_length = 0;
  (this->TargetNameImport).field_2._M_local_buf[0] = '\0';
  (this->TargetNamePDB)._M_dataplus._M_p = (pointer)&(this->TargetNamePDB).field_2;
  (this->TargetNamePDB)._M_string_length = 0;
  (this->TargetNamePDB).field_2._M_local_buf[0] = '\0';
  (this->TargetLinkLanguage)._M_dataplus._M_p = (pointer)&(this->TargetLinkLanguage).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->TargetLinkLanguage,"");
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetLinkerLanguage(&local_50,target,psVar2);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  TVar1 = cmGeneratorTarget::GetType(target);
  psVar2 = &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
            ConfigName;
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  if (TVar1 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames
              (this_00,&this->TargetNameOut,&this->TargetNameReal,&this->TargetNameImport,
               &this->TargetNamePDB,psVar2);
  }
  else {
    cmGeneratorTarget::GetLibraryNames
              (this_00,&this->TargetNameOut,&this->TargetNameSO,&this->TargetNameReal,
               &this->TargetNameImport,&this->TargetNamePDB,psVar2);
  }
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 != OBJECT_LIBRARY) {
    psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetDirectory(&local_50,target,psVar2,false);
    cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = (cmOSXBundleGenerator *)operator_new(0x40);
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_01,target,psVar2);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_01;
  this_01->MacContentFolders = &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::
cmNinjaNormalTargetGenerator(cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetNameOut()
  , TargetNameSO()
  , TargetNameReal()
  , TargetNameImport()
  , TargetNamePDB()
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmState::EXECUTABLE)
    this->GetGeneratorTarget()->GetExecutableNames(this->TargetNameOut,
                               this->TargetNameReal,
                               this->TargetNameImport,
                               this->TargetNamePDB,
                               GetLocalGenerator()->GetConfigName());
  else
    this->GetGeneratorTarget()->GetLibraryNames(this->TargetNameOut,
                            this->TargetNameSO,
                            this->TargetNameReal,
                            this->TargetNameImport,
                            this->TargetNamePDB,
                            GetLocalGenerator()->GetConfigName());

  if(target->GetType() != cmState::OBJECT_LIBRARY)
    {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->GetDirectory(this->GetConfigName()));
    }

  this->OSXBundleGenerator = new cmOSXBundleGenerator(target,
                                                      this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}